

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O3

void Mio_LibraryTransferProfile(Mio_Library_t *pLibDst,Mio_Library_t *pLibSrc)

{
  int iVar1;
  Mio_Gate_t *pMVar2;
  char *pcVar3;
  Mio_Gate_t *pGate;
  char *pcVar4;
  
  for (pMVar2 = Mio_LibraryReadGates(pLibDst); pMVar2 != (Mio_Gate_t *)0x0;
      pMVar2 = Mio_GateReadNext(pMVar2)) {
    Mio_GateSetProfile(pMVar2,0);
  }
  pMVar2 = Mio_LibraryReadGates(pLibSrc);
  do {
    if (pMVar2 == (Mio_Gate_t *)0x0) {
      return;
    }
    iVar1 = Mio_GateReadProfile(pMVar2);
    if (0 < iVar1) {
      pcVar3 = Mio_GateReadName(pMVar2);
      pGate = Mio_LibraryReadGateByName(pLibDst,pcVar3,(char *)0x0);
      if (pGate == (Mio_Gate_t *)0x0) {
        for (pGate = Mio_LibraryReadGates(pLibDst); pGate != (Mio_Gate_t *)0x0;
            pGate = Mio_GateReadNext(pGate)) {
          if ((pGate->field_15).uTruth == (pMVar2->field_15).uTruth) goto LAB_0040ab58;
        }
        pcVar3 = Mio_GateReadName(pMVar2);
        pcVar4 = Mio_LibraryReadName(pLibDst);
        printf("Cannot find gate \"%s\" in library \"%s\".\n",pcVar3,pcVar4);
      }
      else {
LAB_0040ab58:
        iVar1 = Mio_GateReadProfile(pMVar2);
        Mio_GateAddToProfile(pGate,iVar1);
      }
    }
    pMVar2 = Mio_GateReadNext(pMVar2);
  } while( true );
}

Assistant:

void Mio_LibraryTransferProfile( Mio_Library_t * pLibDst, Mio_Library_t * pLibSrc )
{
    Mio_Gate_t * pGateSrc, * pGateDst;    
    Mio_LibraryForEachGate( pLibDst, pGateDst )
        Mio_GateSetProfile( pGateDst, 0 );
    Mio_LibraryForEachGate( pLibSrc, pGateSrc )
        if ( Mio_GateReadProfile(pGateSrc) > 0 )
        {
            // find gate by name
            pGateDst = Mio_LibraryReadGateByName( pLibDst, Mio_GateReadName(pGateSrc), NULL );
            if ( pGateDst == NULL )
            {
                // find gate by function
                Mio_LibraryForEachGate( pLibDst, pGateDst )
                    if ( pGateDst->uTruth == pGateSrc->uTruth )
                        break;
                if ( pGateDst == NULL )
                {
                    printf( "Cannot find gate \"%s\" in library \"%s\".\n", Mio_GateReadName(pGateSrc), Mio_LibraryReadName(pLibDst) );
                    continue;
                }
            }
            Mio_GateAddToProfile( pGateDst, Mio_GateReadProfile(pGateSrc) );
        }
}